

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfdcapi_elements_transaction.cpp
# Opt level: O0

void __thiscall
cfdcapi_elements_transaction_GetTransactionDataByHandle_Test::TestBody
          (cfdcapi_elements_transaction_GetTransactionDataByHandle_Test *this)

{
  bool bVar1;
  char *pcVar2;
  char *message;
  char *in_R9;
  AssertionResult gtest_ar_36;
  AssertionResult gtest_ar_35;
  AssertionResult gtest_ar_34;
  char *str_buffer;
  AssertionResult gtest_ar_33;
  AssertionResult gtest_ar_32;
  AssertionResult gtest_ar_31;
  AssertionResult gtest_ar_30;
  AssertionResult gtest_ar_29;
  AssertionResult gtest_ar_28;
  AssertionResult gtest_ar_27;
  char *locking_script;
  char *nonce_1;
  char *value_commitment;
  int64_t value_satoshi;
  char *asset_string;
  AssertionResult gtest_ar_26;
  AssertionResult gtest_ar_25;
  AssertionResult gtest_ar_24;
  AssertionResult gtest_ar_23;
  AssertionResult gtest_ar_22;
  AssertionResult gtest_ar_21;
  AssertionResult gtest_ar_20;
  int64_t token_amount;
  int64_t asset_amount;
  char *token_value;
  char *asset_value;
  char *nonce;
  char *entropy;
  AssertionResult gtest_ar_19;
  AssertionResult gtest_ar_18;
  AssertionResult gtest_ar_17;
  AssertionResult gtest_ar_16;
  AssertionResult gtest_ar_15;
  AssertionResult gtest_ar_14;
  AssertionResult gtest_ar_13;
  AssertionResult gtest_ar_12;
  AssertionResult gtest_ar_11;
  AssertionResult gtest_ar_10;
  AssertionResult gtest_ar_9;
  AssertionResult gtest_ar_8;
  AssertionResult gtest_ar_7;
  AssertionResult gtest_ar_6;
  uint32_t locktime;
  uint32_t version;
  uint32_t weight;
  uint32_t vsize;
  uint32_t size;
  char *wit_hash;
  char *wtxid;
  uint32_t sequence;
  uint32_t vout;
  char *script_sig;
  char *txid;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar__1;
  AssertionResult gtest_ar_1;
  void *tx_handle;
  uint32_t txout_count;
  uint32_t txin_count;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  int ret;
  void *handle;
  bool *in_stack_fffffffffffff578;
  undefined4 *puVar3;
  char **ppcVar4;
  AssertionResult *in_stack_fffffffffffff580;
  char **in_stack_fffffffffffff588;
  char *in_stack_fffffffffffff590;
  char **in_stack_fffffffffffff598;
  int64_t *in_stack_fffffffffffff5a0;
  char **in_stack_fffffffffffff5a8;
  undefined8 in_stack_fffffffffffff5b0;
  uint32_t index;
  AssertionResult *pAVar5;
  undefined7 in_stack_fffffffffffff5b8;
  undefined1 in_stack_fffffffffffff5bf;
  void *in_stack_fffffffffffff5c0;
  undefined7 in_stack_fffffffffffff5d0;
  undefined1 in_stack_fffffffffffff5d7;
  char **in_stack_fffffffffffff5d8;
  AssertionResult *in_stack_fffffffffffff610;
  undefined7 in_stack_fffffffffffff618;
  undefined1 in_stack_fffffffffffff61f;
  uint32_t *in_stack_fffffffffffff638;
  void *in_stack_fffffffffffff640;
  undefined7 in_stack_fffffffffffff648;
  undefined1 in_stack_fffffffffffff64f;
  char *in_stack_fffffffffffff650;
  AssertionResult *in_stack_fffffffffffff658;
  void **in_stack_fffffffffffff740;
  char *in_stack_fffffffffffff748;
  int in_stack_fffffffffffff754;
  void *in_stack_fffffffffffff758;
  uint32_t *in_stack_fffffffffffff7a0;
  char **in_stack_fffffffffffff7a8;
  undefined7 in_stack_fffffffffffff7b0;
  undefined1 in_stack_fffffffffffff7b7;
  char **in_stack_fffffffffffff7b8;
  void *in_stack_fffffffffffff7c0;
  undefined7 in_stack_fffffffffffff7c8;
  undefined1 in_stack_fffffffffffff7cf;
  undefined7 in_stack_fffffffffffff7e0;
  undefined1 in_stack_fffffffffffff7e7;
  uint32_t *in_stack_fffffffffffff7e8;
  uint32_t *in_stack_fffffffffffff7f0;
  undefined7 in_stack_fffffffffffff7f8;
  undefined1 in_stack_fffffffffffff7ff;
  AssertHelper local_6c0;
  Message local_6b8;
  undefined4 local_6ac;
  AssertionResult local_6a8;
  AssertHelper local_698;
  Message local_690;
  AssertionResult local_688;
  AssertHelper local_678;
  Message local_670;
  undefined4 local_664;
  uint32_t *in_stack_fffffffffffff9a0;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffff9a8;
  char **in_stack_fffffffffffff9b0;
  uint32_t in_stack_fffffffffffff9bc;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffff9c0;
  undefined4 in_stack_fffffffffffff9c8;
  undefined4 in_stack_fffffffffffff9cc;
  AssertionResult local_630;
  AssertHelper in_stack_fffffffffffff9e0;
  Message local_618;
  undefined4 local_60c;
  AssertionResult local_608;
  AssertHelper local_5f8;
  Message local_5f0;
  AssertionResult local_5e8;
  AssertHelper local_5d8;
  Message local_5d0;
  AssertionResult local_5c8;
  AssertHelper local_5b8;
  Message local_5b0;
  AssertionResult local_5a8;
  AssertHelper local_598;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffa70;
  char **in_stack_fffffffffffffa78;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffa80;
  uint32_t in_stack_fffffffffffffa8c;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffa90;
  undefined4 in_stack_fffffffffffffa98;
  undefined4 in_stack_fffffffffffffa9c;
  AssertionResult local_560;
  char **in_stack_fffffffffffffab0;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffab8;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> rhs;
  char **in_stack_fffffffffffffac0;
  char *pcVar6;
  char **in_stack_fffffffffffffac8;
  char **in_stack_fffffffffffffad0;
  char *pcVar7;
  AssertHelper local_528;
  Message local_520;
  undefined4 local_514;
  AssertionResult local_510;
  AssertHelper local_500;
  Message local_4f8;
  undefined4 local_4ec;
  AssertionResult local_4e8;
  AssertHelper local_4d8;
  Message local_4d0;
  AssertionResult local_4c8;
  AssertHelper local_4b8;
  Message local_4b0;
  AssertionResult local_4a8;
  AssertHelper local_498;
  Message local_490;
  AssertionResult local_488;
  AssertHelper local_478;
  Message local_470;
  AssertionResult local_468;
  AssertHelper local_458;
  Message local_450;
  undefined4 local_444;
  AssertionResult local_440;
  AssertionResult local_430;
  char *local_420;
  char *local_418;
  char *local_410;
  char *local_408;
  AssertHelper local_400;
  Message local_3f8;
  undefined4 local_3ec;
  AssertionResult local_3e8;
  AssertHelper local_3d8;
  Message local_3d0;
  AssertionResult local_3c8;
  AssertHelper local_3b8;
  Message local_3b0;
  undefined4 local_3a4;
  AssertionResult local_3a0;
  AssertHelper local_390;
  Message local_388;
  AssertionResult local_380;
  AssertHelper local_370;
  Message local_368;
  undefined4 local_35c;
  AssertionResult local_358;
  AssertHelper local_348;
  Message local_340;
  undefined4 local_334;
  AssertionResult local_330;
  AssertHelper local_320;
  Message local_318;
  undefined4 local_30c;
  AssertionResult local_308;
  AssertHelper local_2f8;
  Message local_2f0;
  undefined4 local_2e4;
  AssertionResult local_2e0;
  AssertHelper local_2d0;
  Message local_2c8;
  undefined4 local_2bc;
  AssertionResult local_2b8;
  AssertHelper local_2a8;
  Message local_2a0;
  undefined4 local_294;
  AssertionResult local_290;
  AssertHelper local_280;
  Message local_278;
  AssertionResult local_270;
  AssertHelper local_260;
  Message local_258;
  AssertionResult local_250;
  AssertHelper local_240;
  Message local_238;
  AssertionResult local_230;
  AssertHelper local_220;
  Message local_218;
  undefined4 local_20c;
  AssertionResult local_208;
  char local_1f4 [4];
  undefined1 local_1f0 [8];
  undefined4 local_1e8;
  undefined4 local_1e4;
  char *local_1e0;
  char *local_1d8;
  undefined4 local_1d0;
  undefined4 local_1cc;
  char *local_1c8;
  char *local_1c0;
  AssertHelper local_1b8;
  Message local_1b0;
  undefined4 local_1a4;
  AssertionResult local_1a0;
  AssertHelper local_190;
  Message local_188;
  undefined4 local_17c;
  AssertionResult local_178;
  AssertHelper local_168;
  Message local_160;
  undefined4 local_154;
  AssertionResult local_150;
  AssertHelper local_140;
  Message local_138;
  undefined4 local_12c;
  AssertionResult local_128;
  string local_118;
  AssertHelper local_f8;
  Message local_f0;
  undefined1 local_e1;
  AssertionResult local_e0;
  AssertHelper local_d0;
  Message local_c8;
  undefined4 local_bc;
  AssertionResult local_b8;
  long local_a8;
  undefined4 local_a0;
  undefined4 local_9c;
  string local_98;
  AssertHelper local_78;
  Message local_70;
  undefined1 local_61;
  AssertionResult local_60;
  AssertHelper local_50;
  Message local_48 [3];
  undefined4 local_2c;
  AssertionResult local_28;
  int local_14;
  long local_10;
  
  index = (uint32_t)((ulong)in_stack_fffffffffffff5b0 >> 0x20);
  local_10 = 0;
  local_14 = CfdCreateHandle(in_stack_fffffffffffff598);
  local_2c = 0;
  testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
            ((char *)in_stack_fffffffffffff598,in_stack_fffffffffffff590,
             (CfdErrorCode *)in_stack_fffffffffffff588,(int *)in_stack_fffffffffffff580);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_28);
  if (!bVar1) {
    testing::Message::Message(local_48);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x33b9ba);
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
               ,500,pcVar2);
    testing::internal::AssertHelper::operator=(&local_50,local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_50);
    testing::Message::~Message((Message *)0x33ba1d);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x33ba72);
  local_61 = local_10 != 0;
  testing::AssertionResult::AssertionResult<bool>
            (in_stack_fffffffffffff580,in_stack_fffffffffffff578,(type *)0x33baa6);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_60);
  if (!bVar1) {
    testing::Message::Message(&local_70);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_98,(internal *)&local_60,(AssertionResult *)"(NULL == handle)","true","false",
               in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
               ,0x1f5,pcVar2);
    testing::internal::AssertHelper::operator=(&local_78,&local_70);
    testing::internal::AssertHelper::~AssertHelper(&local_78);
    std::__cxx11::string::~string((string *)&local_98);
    testing::Message::~Message((Message *)0x33bba2);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x33bc1d);
  local_9c = 0;
  local_a0 = 0;
  local_a8 = 0;
  local_14 = CfdInitializeTxDataHandle
                       (in_stack_fffffffffffff758,in_stack_fffffffffffff754,
                        in_stack_fffffffffffff748,in_stack_fffffffffffff740);
  local_bc = 0;
  testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
            ((char *)in_stack_fffffffffffff598,in_stack_fffffffffffff590,
             (CfdErrorCode *)in_stack_fffffffffffff588,(int *)in_stack_fffffffffffff580);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_b8);
  if (!bVar1) {
    testing::Message::Message(&local_c8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x33bd14);
    testing::internal::AssertHelper::AssertHelper
              (&local_d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
               ,0x1fe,pcVar2);
    testing::internal::AssertHelper::operator=(&local_d0,&local_c8);
    testing::internal::AssertHelper::~AssertHelper(&local_d0);
    testing::Message::~Message((Message *)0x33bd77);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x33bdcc);
  local_e1 = local_a8 != local_10;
  testing::AssertionResult::AssertionResult<bool>
            (in_stack_fffffffffffff580,in_stack_fffffffffffff578,(type *)0x33be08);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_e0);
  if (!bVar1) {
    testing::Message::Message(&local_f0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_118,(internal *)&local_e0,(AssertionResult *)"(tx_handle == handle)","true",
               "false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
               ,0x1ff,pcVar2);
    testing::internal::AssertHelper::operator=(&local_f8,&local_f0);
    testing::internal::AssertHelper::~AssertHelper(&local_f8);
    std::__cxx11::string::~string((string *)&local_118);
    testing::Message::~Message((Message *)0x33bf04);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x33bf7f);
  if (local_14 == 0) {
    local_14 = CfdGetTxInCountByHandle
                         ((void *)CONCAT17(in_stack_fffffffffffff64f,in_stack_fffffffffffff648),
                          in_stack_fffffffffffff640,in_stack_fffffffffffff638);
    local_12c = 0;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)in_stack_fffffffffffff598,in_stack_fffffffffffff590,
               (CfdErrorCode *)in_stack_fffffffffffff588,(int *)in_stack_fffffffffffff580);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_128);
    if (!bVar1) {
      testing::Message::Message(&local_138);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x33c05e);
      testing::internal::AssertHelper::AssertHelper
                (&local_140,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                 ,0x202,pcVar2);
      testing::internal::AssertHelper::operator=(&local_140,&local_138);
      testing::internal::AssertHelper::~AssertHelper(&local_140);
      testing::Message::~Message((Message *)0x33c0c1);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x33c116);
    local_154 = 2;
    testing::internal::EqHelper<false>::Compare<int,unsigned_int>
              ((char *)in_stack_fffffffffffff598,in_stack_fffffffffffff590,
               (int *)in_stack_fffffffffffff588,(uint *)in_stack_fffffffffffff580);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_150);
    if (!bVar1) {
      testing::Message::Message(&local_160);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x33c1c3);
      testing::internal::AssertHelper::AssertHelper
                (&local_168,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                 ,0x203,pcVar2);
      testing::internal::AssertHelper::operator=(&local_168,&local_160);
      testing::internal::AssertHelper::~AssertHelper(&local_168);
      testing::Message::~Message((Message *)0x33c226);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x33c27e);
    local_14 = CfdGetTxOutCountByHandle
                         ((void *)CONCAT17(in_stack_fffffffffffff64f,in_stack_fffffffffffff648),
                          in_stack_fffffffffffff640,in_stack_fffffffffffff638);
    local_17c = 0;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)in_stack_fffffffffffff598,in_stack_fffffffffffff590,
               (CfdErrorCode *)in_stack_fffffffffffff588,(int *)in_stack_fffffffffffff580);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_178);
    if (!bVar1) {
      testing::Message::Message(&local_188);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x33c34f);
      testing::internal::AssertHelper::AssertHelper
                (&local_190,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                 ,0x206,pcVar2);
      testing::internal::AssertHelper::operator=(&local_190,&local_188);
      testing::internal::AssertHelper::~AssertHelper(&local_190);
      testing::Message::~Message((Message *)0x33c3b2);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x33c407);
    local_1a4 = 4;
    testing::internal::EqHelper<false>::Compare<int,unsigned_int>
              ((char *)in_stack_fffffffffffff598,in_stack_fffffffffffff590,
               (int *)in_stack_fffffffffffff588,(uint *)in_stack_fffffffffffff580);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1a0);
    if (!bVar1) {
      testing::Message::Message(&local_1b0);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x33c4b4);
      testing::internal::AssertHelper::AssertHelper
                (&local_1b8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                 ,0x207,pcVar2);
      testing::internal::AssertHelper::operator=(&local_1b8,&local_1b0);
      testing::internal::AssertHelper::~AssertHelper(&local_1b8);
      testing::Message::~Message((Message *)0x33c517);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x33c56f);
    local_1c0 = (char *)0x0;
    local_1c8 = (char *)0x0;
    local_1cc = 0;
    local_1d0 = 0;
    if (local_14 == 0) {
      local_1d8 = (char *)0x0;
      local_1e0 = (char *)0x0;
      local_1e4 = 0;
      local_1e8 = 0;
      local_1f0._4_4_ = 0;
      local_1f0._0_4_ = 0;
      local_1f4[0] = '\0';
      local_1f4[1] = '\0';
      local_1f4[2] = '\0';
      local_1f4[3] = '\0';
      in_stack_fffffffffffff590 = local_1f4;
      in_stack_fffffffffffff588 = (char **)local_1f0;
      in_stack_fffffffffffff580 = (AssertionResult *)(local_1f0 + 4);
      puVar3 = &local_1e8;
      local_14 = CfdGetConfidentialTxInfoByHandle
                           ((void *)CONCAT17(in_stack_fffffffffffff7cf,in_stack_fffffffffffff7c8),
                            in_stack_fffffffffffff7c0,in_stack_fffffffffffff7b8,
                            (char **)CONCAT17(in_stack_fffffffffffff7b7,in_stack_fffffffffffff7b0),
                            in_stack_fffffffffffff7a8,in_stack_fffffffffffff7a0,
                            (uint32_t *)
                            CONCAT17(in_stack_fffffffffffff7e7,in_stack_fffffffffffff7e0),
                            in_stack_fffffffffffff7e8,in_stack_fffffffffffff7f0,
                            (uint32_t *)
                            CONCAT17(in_stack_fffffffffffff7ff,in_stack_fffffffffffff7f8));
      local_20c = 0;
      testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
                ((char *)in_stack_fffffffffffff598,in_stack_fffffffffffff590,
                 (CfdErrorCode *)in_stack_fffffffffffff588,(int *)in_stack_fffffffffffff580);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_208);
      if (!bVar1) {
        testing::Message::Message(&local_218);
        pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x33c715);
        testing::internal::AssertHelper::AssertHelper
                  (&local_220,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                   ,0x218,pcVar2);
        testing::internal::AssertHelper::operator=(&local_220,&local_218);
        testing::internal::AssertHelper::~AssertHelper(&local_220);
        testing::Message::~Message((Message *)0x33c778);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x33c7cd);
      if (local_14 == 0) {
        testing::internal::CmpHelperSTREQ
                  ((internal *)&local_230,
                   "\"cf7783b2b1de646e35186df988a219a17f0317b5c3f3c47fa4ab2d7463ea3992\"","txid",
                   "cf7783b2b1de646e35186df988a219a17f0317b5c3f3c47fa4ab2d7463ea3992",local_1c0);
        bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_230);
        if (!bVar1) {
          testing::Message::Message(&local_238);
          pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x33c87c);
          testing::internal::AssertHelper::AssertHelper
                    (&local_240,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                     ,0x21a,pcVar2);
          testing::internal::AssertHelper::operator=(&local_240,&local_238);
          testing::internal::AssertHelper::~AssertHelper(&local_240);
          testing::Message::~Message((Message *)0x33c8df);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)0x33c934);
        testing::internal::CmpHelperSTREQ
                  ((internal *)&local_250,
                   "\"cf7783b2b1de646e35186df988a219a17f0317b5c3f3c47fa4ab2d7463ea3992\"","wtxid",
                   "cf7783b2b1de646e35186df988a219a17f0317b5c3f3c47fa4ab2d7463ea3992",local_1d8);
        bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_250);
        if (!bVar1) {
          testing::Message::Message(&local_258);
          pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x33c9d5);
          testing::internal::AssertHelper::AssertHelper
                    (&local_260,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                     ,0x21b,pcVar2);
          testing::internal::AssertHelper::operator=(&local_260,&local_258);
          testing::internal::AssertHelper::~AssertHelper(&local_260);
          testing::Message::~Message((Message *)0x33ca38);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)0x33ca8d);
        testing::internal::CmpHelperSTREQ
                  ((internal *)&local_270,
                   "\"938e3a9b5bac410e812d08db74c4ef2bc58d1ed99d94b637cab0ac2e9eb59df8\"","wit_hash"
                   ,"938e3a9b5bac410e812d08db74c4ef2bc58d1ed99d94b637cab0ac2e9eb59df8",local_1e0);
        bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_270);
        if (!bVar1) {
          testing::Message::Message(&local_278);
          pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x33cb2e);
          testing::internal::AssertHelper::AssertHelper
                    (&local_280,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                     ,0x21c,pcVar2);
          testing::internal::AssertHelper::operator=(&local_280,&local_278);
          testing::internal::AssertHelper::~AssertHelper(&local_280);
          testing::Message::~Message((Message *)0x33cb91);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)0x33cbe6);
        local_294 = 0x200;
        testing::internal::EqHelper<false>::Compare<int,unsigned_int>
                  ((char *)in_stack_fffffffffffff598,in_stack_fffffffffffff590,
                   (int *)in_stack_fffffffffffff588,(uint *)in_stack_fffffffffffff580);
        bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_290);
        if (!bVar1) {
          testing::Message::Message(&local_2a0);
          pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x33cc93);
          testing::internal::AssertHelper::AssertHelper
                    (&local_2a8,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                     ,0x21d,pcVar2);
          testing::internal::AssertHelper::operator=(&local_2a8,&local_2a0);
          testing::internal::AssertHelper::~AssertHelper(&local_2a8);
          testing::Message::~Message((Message *)0x33ccf6);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)0x33cd4b);
        local_2bc = 0x200;
        testing::internal::EqHelper<false>::Compare<int,unsigned_int>
                  ((char *)in_stack_fffffffffffff598,in_stack_fffffffffffff590,
                   (int *)in_stack_fffffffffffff588,(uint *)in_stack_fffffffffffff580);
        bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_2b8);
        if (!bVar1) {
          testing::Message::Message(&local_2c8);
          pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x33cdf8);
          testing::internal::AssertHelper::AssertHelper
                    (&local_2d0,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                     ,0x21e,pcVar2);
          testing::internal::AssertHelper::operator=(&local_2d0,&local_2c8);
          testing::internal::AssertHelper::~AssertHelper(&local_2d0);
          testing::Message::~Message((Message *)0x33ce5b);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)0x33ceb0);
        local_2e4 = 0x800;
        pAVar5 = &local_2e0;
        testing::internal::EqHelper<false>::Compare<int,unsigned_int>
                  ((char *)in_stack_fffffffffffff598,in_stack_fffffffffffff590,
                   (int *)in_stack_fffffffffffff588,(uint *)in_stack_fffffffffffff580);
        bVar1 = testing::AssertionResult::operator_cast_to_bool(pAVar5);
        if (!bVar1) {
          testing::Message::Message(&local_2f0);
          pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x33cf5d);
          testing::internal::AssertHelper::AssertHelper
                    (&local_2f8,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                     ,0x21f,pcVar2);
          testing::internal::AssertHelper::operator=(&local_2f8,&local_2f0);
          testing::internal::AssertHelper::~AssertHelper(&local_2f8);
          testing::Message::~Message((Message *)0x33cfc0);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)0x33d015);
        local_30c = 2;
        testing::internal::EqHelper<false>::Compare<int,unsigned_int>
                  ((char *)in_stack_fffffffffffff598,in_stack_fffffffffffff590,
                   (int *)in_stack_fffffffffffff588,(uint *)in_stack_fffffffffffff580);
        bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_308);
        if (!bVar1) {
          testing::Message::Message(&local_318);
          pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x33d0c2);
          testing::internal::AssertHelper::AssertHelper
                    (&local_320,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                     ,0x220,pcVar2);
          testing::internal::AssertHelper::operator=(&local_320,&local_318);
          testing::internal::AssertHelper::~AssertHelper(&local_320);
          testing::Message::~Message((Message *)0x33d125);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)0x33d17a);
        local_334 = 0;
        pAVar5 = &local_330;
        testing::internal::EqHelper<true>::Compare<int,unsigned_int>
                  ((char *)in_stack_fffffffffffff598,in_stack_fffffffffffff590,
                   (int *)in_stack_fffffffffffff588,(uint *)in_stack_fffffffffffff580,puVar3);
        bVar1 = testing::AssertionResult::operator_cast_to_bool(pAVar5);
        if (!bVar1) {
          testing::Message::Message(&local_340);
          pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x33d22c);
          testing::internal::AssertHelper::AssertHelper
                    (&local_348,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                     ,0x221,pcVar2);
          testing::internal::AssertHelper::operator=(&local_348,&local_340);
          testing::internal::AssertHelper::~AssertHelper(&local_348);
          testing::Message::~Message((Message *)0x33d28f);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)0x33d2e4);
        CfdFreeStringBuffer((char *)in_stack_fffffffffffff588);
        CfdFreeStringBuffer((char *)in_stack_fffffffffffff588);
        CfdFreeStringBuffer((char *)in_stack_fffffffffffff588);
        local_1c0 = (char *)0x0;
      }
    }
    if (local_14 == 0) {
      local_14 = CfdGetTxInByHandle((void *)CONCAT44(in_stack_fffffffffffff9cc,
                                                     in_stack_fffffffffffff9c8),
                                    in_stack_fffffffffffff9c0.ptr_,in_stack_fffffffffffff9bc,
                                    in_stack_fffffffffffff9b0,
                                    (uint32_t *)in_stack_fffffffffffff9a8.ptr_,
                                    in_stack_fffffffffffff9a0,
                                    (char **)in_stack_fffffffffffff9e0.data_);
      local_35c = 0;
      pAVar5 = &local_358;
      testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
                ((char *)in_stack_fffffffffffff598,in_stack_fffffffffffff590,
                 (CfdErrorCode *)in_stack_fffffffffffff588,(int *)in_stack_fffffffffffff580);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(pAVar5);
      if (!bVar1) {
        testing::Message::Message(&local_368);
        pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x33d41d);
        testing::internal::AssertHelper::AssertHelper
                  (&local_370,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                   ,0x22c,pcVar2);
        testing::internal::AssertHelper::operator=(&local_370,&local_368);
        testing::internal::AssertHelper::~AssertHelper(&local_370);
        testing::Message::~Message((Message *)0x33d480);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x33d4d5);
      if (local_14 == 0) {
        testing::internal::CmpHelperSTREQ
                  ((internal *)&local_380,
                   "\"57a15002d066ce52573d674df925c9bc0f1164849420705f2cfad8a68111230f\"","txid",
                   "57a15002d066ce52573d674df925c9bc0f1164849420705f2cfad8a68111230f",local_1c0);
        bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_380);
        if (!bVar1) {
          testing::Message::Message(&local_388);
          pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x33d584);
          testing::internal::AssertHelper::AssertHelper
                    (&local_390,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                     ,0x22e,pcVar2);
          testing::internal::AssertHelper::operator=(&local_390,&local_388);
          testing::internal::AssertHelper::~AssertHelper(&local_390);
          testing::Message::~Message((Message *)0x33d5e7);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)0x33d63c);
        local_3a4 = 1;
        testing::internal::EqHelper<false>::Compare<int,unsigned_int>
                  ((char *)in_stack_fffffffffffff598,in_stack_fffffffffffff590,
                   (int *)in_stack_fffffffffffff588,(uint *)in_stack_fffffffffffff580);
        bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_3a0);
        if (!bVar1) {
          testing::Message::Message(&local_3b0);
          pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x33d6e9);
          testing::internal::AssertHelper::AssertHelper
                    (&local_3b8,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                     ,0x22f,pcVar2);
          testing::internal::AssertHelper::operator=(&local_3b8,&local_3b0);
          testing::internal::AssertHelper::~AssertHelper(&local_3b8);
          testing::Message::~Message((Message *)0x33d74c);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)0x33d7a1);
        testing::internal::CmpHelperSTREQ((internal *)&local_3c8,"\"\"","script_sig","",local_1c8);
        bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_3c8);
        if (!bVar1) {
          testing::Message::Message(&local_3d0);
          pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x33d842);
          testing::internal::AssertHelper::AssertHelper
                    (&local_3d8,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                     ,0x230,pcVar2);
          testing::internal::AssertHelper::operator=(&local_3d8,&local_3d0);
          testing::internal::AssertHelper::~AssertHelper(&local_3d8);
          testing::Message::~Message((Message *)0x33d8a5);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)0x33d8fa);
        local_3ec = 0xffffffff;
        pAVar5 = &local_3e8;
        testing::internal::EqHelper<false>::Compare<unsigned_int,unsigned_int>
                  ((char *)in_stack_fffffffffffff598,in_stack_fffffffffffff590,
                   (uint *)in_stack_fffffffffffff588,(uint *)in_stack_fffffffffffff580);
        bVar1 = testing::AssertionResult::operator_cast_to_bool(pAVar5);
        if (!bVar1) {
          testing::Message::Message(&local_3f8);
          pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x33d9a7);
          testing::internal::AssertHelper::AssertHelper
                    (&local_400,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                     ,0x231,pcVar2);
          testing::internal::AssertHelper::operator=(&local_400,&local_3f8);
          testing::internal::AssertHelper::~AssertHelper(&local_400);
          testing::Message::~Message((Message *)0x33da0a);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)0x33da5f);
        CfdFreeStringBuffer((char *)in_stack_fffffffffffff588);
        CfdFreeStringBuffer((char *)in_stack_fffffffffffff588);
        local_1c0 = (char *)0x0;
        local_1c8 = (char *)0x0;
      }
    }
    if (local_14 == 0) {
      local_408 = (char *)0x0;
      local_410 = (char *)0x0;
      local_418 = (char *)0x0;
      local_420 = (char *)0x0;
      local_430.message_.ptr_ =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      local_430.success_ = false;
      local_430._1_7_ = 0;
      in_stack_fffffffffffff588 = &local_420;
      in_stack_fffffffffffff580 = &local_430;
      ppcVar4 = &local_418;
      in_stack_fffffffffffff598 = (char **)0x0;
      in_stack_fffffffffffff590 = (char *)0x0;
      local_14 = CfdGetTxInIssuanceInfoByHandle
                           ((void *)CONCAT44(in_stack_fffffffffffffa9c,in_stack_fffffffffffffa98),
                            in_stack_fffffffffffffa90.ptr_,in_stack_fffffffffffffa8c,
                            (char **)in_stack_fffffffffffffa80.ptr_,in_stack_fffffffffffffa78,
                            (int64_t *)in_stack_fffffffffffffa70.ptr_,in_stack_fffffffffffffab0,
                            (int64_t *)in_stack_fffffffffffffab8.ptr_,in_stack_fffffffffffffac0,
                            in_stack_fffffffffffffac8,in_stack_fffffffffffffad0);
      local_444 = 0;
      testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
                ((char *)in_stack_fffffffffffff598,in_stack_fffffffffffff590,
                 (CfdErrorCode *)in_stack_fffffffffffff588,(int *)in_stack_fffffffffffff580);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_440);
      if (!bVar1) {
        testing::Message::Message(&local_450);
        pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x33dc07);
        testing::internal::AssertHelper::AssertHelper
                  (&local_458,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                   ,0x243,pcVar2);
        testing::internal::AssertHelper::operator=(&local_458,&local_450);
        testing::internal::AssertHelper::~AssertHelper(&local_458);
        testing::Message::~Message((Message *)0x33dc6a);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x33dcbf);
      if (local_14 == 0) {
        testing::internal::CmpHelperSTREQ
                  ((internal *)&local_468,
                   "\"6f9ccf5949eba5d6a08bff7a015e825c97824e82d57c8a0c77f9a41908fe8306\"","entropy",
                   "6f9ccf5949eba5d6a08bff7a015e825c97824e82d57c8a0c77f9a41908fe8306",local_408);
        bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_468);
        if (!bVar1) {
          testing::Message::Message(&local_470);
          pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x33dd6e);
          testing::internal::AssertHelper::AssertHelper
                    (&local_478,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                     ,0x245,pcVar2);
          testing::internal::AssertHelper::operator=(&local_478,&local_470);
          testing::internal::AssertHelper::~AssertHelper(&local_478);
          testing::Message::~Message((Message *)0x33ddd1);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)0x33de26);
        testing::internal::CmpHelperSTREQ
                  ((internal *)&local_488,
                   "\"0b8954757234fd3ec9cf0dd6ef0a89d825ec56a9532e7da4b6cb90c51be3bbd8\"","nonce",
                   "0b8954757234fd3ec9cf0dd6ef0a89d825ec56a9532e7da4b6cb90c51be3bbd8",local_410);
        bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_488);
        if (!bVar1) {
          testing::Message::Message(&local_490);
          pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x33dec7);
          testing::internal::AssertHelper::AssertHelper
                    (&local_498,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                     ,0x246,pcVar2);
          testing::internal::AssertHelper::operator=(&local_498,&local_490);
          testing::internal::AssertHelper::~AssertHelper(&local_498);
          testing::Message::~Message((Message *)0x33df2a);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)0x33df7f);
        testing::internal::CmpHelperSTREQ
                  ((internal *)&local_4a8,"\"010000000023c34600\"","asset_value",
                   "010000000023c34600",local_418);
        bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_4a8);
        if (!bVar1) {
          testing::Message::Message(&local_4b0);
          pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x33e020);
          testing::internal::AssertHelper::AssertHelper
                    (&local_4b8,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                     ,0x247,pcVar2);
          testing::internal::AssertHelper::operator=(&local_4b8,&local_4b0);
          testing::internal::AssertHelper::~AssertHelper(&local_4b8);
          testing::Message::~Message((Message *)0x33e083);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)0x33e0d8);
        testing::internal::CmpHelperSTREQ((internal *)&local_4c8,"\"\"","token_value","",local_420);
        bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_4c8);
        if (!bVar1) {
          testing::Message::Message(&local_4d0);
          pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x33e179);
          testing::internal::AssertHelper::AssertHelper
                    (&local_4d8,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                     ,0x248,pcVar2);
          testing::internal::AssertHelper::operator=(&local_4d8,&local_4d0);
          testing::internal::AssertHelper::~AssertHelper(&local_4d8);
          testing::Message::~Message((Message *)0x33e1dc);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)0x33e231);
        local_4ec = 600000000;
        testing::internal::EqHelper<false>::Compare<int,long>
                  ((char *)in_stack_fffffffffffff598,in_stack_fffffffffffff590,
                   (int *)in_stack_fffffffffffff588,(long *)in_stack_fffffffffffff580);
        bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_4e8);
        if (!bVar1) {
          testing::Message::Message(&local_4f8);
          pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x33e2de);
          testing::internal::AssertHelper::AssertHelper
                    (&local_500,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                     ,0x249,pcVar2);
          testing::internal::AssertHelper::operator=(&local_500,&local_4f8);
          testing::internal::AssertHelper::~AssertHelper(&local_500);
          testing::Message::~Message((Message *)0x33e341);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)0x33e396);
        local_514 = 0;
        testing::internal::EqHelper<true>::Compare<int,long>
                  ((char *)in_stack_fffffffffffff598,in_stack_fffffffffffff590,
                   (int *)in_stack_fffffffffffff588,(long *)in_stack_fffffffffffff580,ppcVar4);
        bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_510);
        if (!bVar1) {
          testing::Message::Message(&local_520);
          pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x33e448);
          testing::internal::AssertHelper::AssertHelper
                    (&local_528,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                     ,0x24a,pcVar2);
          testing::internal::AssertHelper::operator=(&local_528,&local_520);
          testing::internal::AssertHelper::~AssertHelper(&local_528);
          testing::Message::~Message((Message *)0x33e4ab);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)0x33e500);
        CfdFreeStringBuffer((char *)in_stack_fffffffffffff588);
        CfdFreeStringBuffer((char *)in_stack_fffffffffffff588);
        CfdFreeStringBuffer((char *)in_stack_fffffffffffff588);
        CfdFreeStringBuffer((char *)in_stack_fffffffffffff588);
      }
    }
    if (local_14 == 0) {
      pcVar7 = (char *)0x0;
      pcVar6 = (char *)0x0;
      rhs.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      pcVar2 = (char *)0x0;
      in_stack_fffffffffffff580 = (AssertionResult *)&stack0xfffffffffffffab0;
      local_14 = CfdGetConfidentialTxOutSimpleByHandle
                           (in_stack_fffffffffffff5c0,
                            (void *)CONCAT17(in_stack_fffffffffffff5bf,in_stack_fffffffffffff5b8),
                            index,in_stack_fffffffffffff5a8,in_stack_fffffffffffff5a0,
                            in_stack_fffffffffffff598,
                            (char **)CONCAT17(in_stack_fffffffffffff5d7,in_stack_fffffffffffff5d0),
                            in_stack_fffffffffffff5d8);
      testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
                ((char *)in_stack_fffffffffffff598,in_stack_fffffffffffff590,
                 (CfdErrorCode *)in_stack_fffffffffffff588,(int *)in_stack_fffffffffffff580);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_560);
      if (!bVar1) {
        testing::Message::Message((Message *)&stack0xfffffffffffffa90);
        message = testing::AssertionResult::failure_message((AssertionResult *)0x33e682);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&stack0xfffffffffffffa88,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                   ,0x25c,message);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&stack0xfffffffffffffa88,(Message *)&stack0xfffffffffffffa90);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffffa88);
        testing::Message::~Message((Message *)0x33e6e5);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x33e73a);
      if (local_14 == 0) {
        testing::internal::CmpHelperSTREQ
                  ((internal *)&stack0xfffffffffffffa78,
                   "\"accb7354c07974e00b32e4e5eef55078490141675592ac3610e6101831edb0cd\"",
                   "asset_string","accb7354c07974e00b32e4e5eef55078490141675592ac3610e6101831edb0cd"
                   ,pcVar7);
        bVar1 = testing::AssertionResult::operator_cast_to_bool
                          ((AssertionResult *)&stack0xfffffffffffffa78);
        if (!bVar1) {
          testing::Message::Message((Message *)&stack0xfffffffffffffa70);
          pcVar7 = testing::AssertionResult::failure_message((AssertionResult *)0x33e7e9);
          testing::internal::AssertHelper::AssertHelper
                    (&local_598,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                     ,0x25e,pcVar7);
          testing::internal::AssertHelper::operator=(&local_598,(Message *)&stack0xfffffffffffffa70)
          ;
          testing::internal::AssertHelper::~AssertHelper(&local_598);
          testing::Message::~Message((Message *)0x33e84c);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)0x33e8a1);
        in_stack_fffffffffffff658 = &local_5a8;
        testing::internal::CmpHelperSTREQ
                  ((internal *)in_stack_fffffffffffff658,"\"010000000023c34600\"","value_commitment"
                   ,"010000000023c34600",pcVar6);
        bVar1 = testing::AssertionResult::operator_cast_to_bool(in_stack_fffffffffffff658);
        if (!bVar1) {
          testing::Message::Message(&local_5b0);
          in_stack_fffffffffffff650 =
               testing::AssertionResult::failure_message((AssertionResult *)0x33e942);
          testing::internal::AssertHelper::AssertHelper
                    (&local_5b8,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                     ,0x25f,in_stack_fffffffffffff650);
          testing::internal::AssertHelper::operator=(&local_5b8,&local_5b0);
          testing::internal::AssertHelper::~AssertHelper(&local_5b8);
          testing::Message::~Message((Message *)0x33e9a5);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)0x33e9fa);
        pAVar5 = &local_5c8;
        testing::internal::CmpHelperSTREQ
                  ((internal *)pAVar5,
                   "\"03ce4c4eac09fe317f365e45c00ffcf2e9639bc0fd792c10f72cdc173c4e5ed879\"","nonce",
                   "03ce4c4eac09fe317f365e45c00ffcf2e9639bc0fd792c10f72cdc173c4e5ed879",
                   (char *)rhs.ptr_);
        bVar1 = testing::AssertionResult::operator_cast_to_bool(pAVar5);
        if (!bVar1) {
          testing::Message::Message(&local_5d0);
          pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)0x33ea9b);
          testing::internal::AssertHelper::AssertHelper
                    (&local_5d8,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                     ,0x260,pcVar6);
          testing::internal::AssertHelper::operator=(&local_5d8,&local_5d0);
          testing::internal::AssertHelper::~AssertHelper(&local_5d8);
          testing::Message::~Message((Message *)0x33eafe);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)0x33eb53);
        testing::internal::CmpHelperSTREQ
                  ((internal *)&local_5e8,"\"76a9149bdcb18911fa9faad6632ca43b81739082b0a19588ac\"",
                   "locking_script","76a9149bdcb18911fa9faad6632ca43b81739082b0a19588ac",pcVar2);
        bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_5e8);
        if (!bVar1) {
          testing::Message::Message(&local_5f0);
          pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x33ebf4);
          testing::internal::AssertHelper::AssertHelper
                    (&local_5f8,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                     ,0x261,pcVar2);
          testing::internal::AssertHelper::operator=(&local_5f8,&local_5f0);
          testing::internal::AssertHelper::~AssertHelper(&local_5f8);
          testing::Message::~Message((Message *)0x33ec57);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)0x33ecac);
        local_60c = 600000000;
        in_stack_fffffffffffff610 = &local_608;
        testing::internal::EqHelper<false>::Compare<int,long>
                  ((char *)in_stack_fffffffffffff598,in_stack_fffffffffffff590,
                   (int *)in_stack_fffffffffffff588,(long *)in_stack_fffffffffffff580);
        in_stack_fffffffffffff61f =
             testing::AssertionResult::operator_cast_to_bool(in_stack_fffffffffffff610);
        if (!(bool)in_stack_fffffffffffff61f) {
          testing::Message::Message(&local_618);
          pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x33ed59);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&stack0xfffffffffffff9e0,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                     ,0x262,pcVar2);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&stack0xfffffffffffff9e0,&local_618);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffff9e0);
          testing::Message::~Message((Message *)0x33edbc);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)0x33ee11);
        CfdFreeStringBuffer((char *)in_stack_fffffffffffff588);
        CfdFreeStringBuffer((char *)in_stack_fffffffffffff588);
        CfdFreeStringBuffer((char *)in_stack_fffffffffffff588);
        CfdFreeStringBuffer((char *)in_stack_fffffffffffff588);
      }
    }
    local_14 = CfdFreeTxDataHandle(in_stack_fffffffffffff658,in_stack_fffffffffffff650);
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)in_stack_fffffffffffff598,in_stack_fffffffffffff590,
               (CfdErrorCode *)in_stack_fffffffffffff588,(int *)in_stack_fffffffffffff580);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_630);
    if (!bVar1) {
      testing::Message::Message((Message *)&stack0xfffffffffffff9c0);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x33ef12);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&stack0xfffffffffffff9b8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                 ,0x26c,pcVar2);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&stack0xfffffffffffff9b8,(Message *)&stack0xfffffffffffff9c0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffff9b8);
      testing::Message::~Message((Message *)0x33ef6f);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x33efc4);
  }
  local_14 = CfdGetLastErrorCode((void *)CONCAT17(in_stack_fffffffffffff5bf,
                                                  in_stack_fffffffffffff5b8));
  if (local_14 != 0) {
    pcVar2 = (char *)0x0;
    local_14 = CfdGetLastErrorMessage
                         ((void *)CONCAT17(in_stack_fffffffffffff61f,in_stack_fffffffffffff618),
                          (char **)in_stack_fffffffffffff610);
    local_664 = 0;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)in_stack_fffffffffffff598,in_stack_fffffffffffff590,
               (CfdErrorCode *)in_stack_fffffffffffff588,(int *)in_stack_fffffffffffff580);
    bVar1 = testing::AssertionResult::operator_cast_to_bool
                      ((AssertionResult *)&stack0xfffffffffffff9a0);
    if (!bVar1) {
      testing::Message::Message(&local_670);
      pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)0x33f0b1);
      testing::internal::AssertHelper::AssertHelper
                (&local_678,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                 ,0x273,pcVar6);
      testing::internal::AssertHelper::operator=(&local_678,&local_670);
      testing::internal::AssertHelper::~AssertHelper(&local_678);
      testing::Message::~Message((Message *)0x33f10e);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x33f163);
    testing::internal::CmpHelperSTREQ((internal *)&local_688,"\"\"","str_buffer","",pcVar2);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_688);
    if (!bVar1) {
      testing::Message::Message(&local_690);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x33f1f8);
      testing::internal::AssertHelper::AssertHelper
                (&local_698,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                 ,0x274,pcVar2);
      testing::internal::AssertHelper::operator=(&local_698,&local_690);
      testing::internal::AssertHelper::~AssertHelper(&local_698);
      testing::Message::~Message((Message *)0x33f255);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x33f2aa);
    CfdFreeStringBuffer((char *)in_stack_fffffffffffff588);
  }
  local_14 = CfdFreeHandle(in_stack_fffffffffffff588);
  local_6ac = 0;
  pAVar5 = &local_6a8;
  testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
            ((char *)in_stack_fffffffffffff598,in_stack_fffffffffffff590,
             (CfdErrorCode *)in_stack_fffffffffffff588,(int *)in_stack_fffffffffffff580);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(pAVar5);
  if (!bVar1) {
    testing::Message::Message(&local_6b8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x33f37a);
    testing::internal::AssertHelper::AssertHelper
              (&local_6c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
               ,0x27a,pcVar2);
    testing::internal::AssertHelper::operator=(&local_6c0,&local_6b8);
    testing::internal::AssertHelper::~AssertHelper(&local_6c0);
    testing::Message::~Message((Message *)0x33f3d7);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x33f42c);
  return;
}

Assistant:

TEST(cfdcapi_elements_transaction, GetTransactionDataByHandle) {
  void* handle = NULL;
  int ret = CfdCreateHandle(&handle);
  EXPECT_EQ(kCfdSuccess, ret);
  EXPECT_FALSE((NULL == handle));

  static const char* tx_data = "0200000000020f231181a6d8fa2c5f7020948464110fbcc925f94d673d5752ce66d00250a1570000000000ffffffff0f231181a6d8fa2c5f7020948464110fbcc925f94d673d5752ce66d00250a1570100008000ffffffffd8bbe31bc590cbb6a47d2e53a956ec25d8890aefd60dcfc93efd34727554890b0683fe0819a4f9770c8a7cd5824e82975c825e017aff8ba0d6a5eb4959cf9c6f010000000023c346000004017981c1f171d7973a1fd922652f559f47d6d1506a4be2394b27a54951957f6c1801000000003b947f6002200d8510dfcf8e2330c0795c771d1e6064daab2f274ac32a6e2708df9bfa893d17a914ef3e40882e17d6e477082fcafeb0f09dc32d377b87010bad521bafdac767421d45b71b29a349c7b2ca2a06b5d8e3b5898c91df2769ed010000000029b9270002cc645552109331726c0ffadccab21620dd7a5a33260c6ac7bd1c78b98cb1e35a1976a9146c22e209d36612e0d9d2a20b814d7d8648cc7a7788ac017981c1f171d7973a1fd922652f559f47d6d1506a4be2394b27a54951957f6c1801000000000000c350000001cdb0ed311810e61036ac9255674101497850f5eee5e4320be07479c05473cbac010000000023c3460003ce4c4eac09fe317f365e45c00ffcf2e9639bc0fd792c10f72cdc173c4e5ed8791976a9149bdcb18911fa9faad6632ca43b81739082b0a19588ac00000000";

  uint32_t txin_count = 0;
  uint32_t txout_count = 0;

  void* tx_handle = NULL;
  ret = CfdInitializeTxDataHandle(handle, kCfdNetworkElementsRegtest, tx_data, &tx_handle);
  EXPECT_EQ(kCfdSuccess, ret);
  EXPECT_FALSE((tx_handle == handle));
  if (ret == kCfdSuccess) {
    ret = CfdGetTxInCountByHandle(handle, tx_handle, &txin_count);
    EXPECT_EQ(kCfdSuccess, ret);
    EXPECT_EQ(2, txin_count);

    ret = CfdGetTxOutCountByHandle(handle, tx_handle, &txout_count);
    EXPECT_EQ(kCfdSuccess, ret);
    EXPECT_EQ(4, txout_count);

    char* txid = nullptr;
    char* script_sig = nullptr;
    uint32_t vout = 0;
    uint32_t sequence = 0;
    if (ret == kCfdSuccess) {
      char* wtxid = nullptr;
      char* wit_hash = nullptr;
      uint32_t size = 0;
      uint32_t vsize = 0;
      uint32_t weight = 0;
      uint32_t version = 0;
      uint32_t locktime = 0;
      ret = CfdGetConfidentialTxInfoByHandle(
          handle, tx_handle, &txid, &wtxid, &wit_hash, &size, &vsize, &weight,
          &version, &locktime);
      EXPECT_EQ(kCfdSuccess, ret);
      if (ret == kCfdSuccess) {
        EXPECT_STREQ("cf7783b2b1de646e35186df988a219a17f0317b5c3f3c47fa4ab2d7463ea3992", txid);
        EXPECT_STREQ("cf7783b2b1de646e35186df988a219a17f0317b5c3f3c47fa4ab2d7463ea3992", wtxid);
        EXPECT_STREQ("938e3a9b5bac410e812d08db74c4ef2bc58d1ed99d94b637cab0ac2e9eb59df8", wit_hash);
        EXPECT_EQ(512, size);
        EXPECT_EQ(512, vsize);
        EXPECT_EQ(2048, weight);
        EXPECT_EQ(2, version);
        EXPECT_EQ(0, locktime);

        CfdFreeStringBuffer(txid);
        CfdFreeStringBuffer(wtxid);
        CfdFreeStringBuffer(wit_hash);
        txid = nullptr;
      }
    }
    if (ret == kCfdSuccess) {
      ret = CfdGetTxInByHandle(
          handle, tx_handle, 1, &txid, &vout, &sequence, &script_sig);
      EXPECT_EQ(kCfdSuccess, ret);
      if (ret == kCfdSuccess) {
        EXPECT_STREQ("57a15002d066ce52573d674df925c9bc0f1164849420705f2cfad8a68111230f", txid);
        EXPECT_EQ(1, vout);
        EXPECT_STREQ("", script_sig);
        EXPECT_EQ(4294967295U, sequence);

        CfdFreeStringBuffer(txid);
        CfdFreeStringBuffer(script_sig);
        txid = nullptr;
        script_sig = nullptr;
      }
    }
    if (ret == kCfdSuccess) {
      char* entropy = nullptr;
      char* nonce = nullptr;
      char* asset_value = nullptr;
      char* token_value = nullptr;
      int64_t asset_amount = 0;
      int64_t token_amount = 0;
      ret = CfdGetTxInIssuanceInfoByHandle(
          handle, tx_handle, 1, &entropy, &nonce, &asset_amount, &asset_value,
          &token_amount, &token_value, nullptr, nullptr);
      EXPECT_EQ(kCfdSuccess, ret);
      if (ret == kCfdSuccess) {
        EXPECT_STREQ("6f9ccf5949eba5d6a08bff7a015e825c97824e82d57c8a0c77f9a41908fe8306", entropy);
        EXPECT_STREQ("0b8954757234fd3ec9cf0dd6ef0a89d825ec56a9532e7da4b6cb90c51be3bbd8", nonce);
        EXPECT_STREQ("010000000023c34600", asset_value);
        EXPECT_STREQ("", token_value);
        EXPECT_EQ(600000000, asset_amount);
        EXPECT_EQ(0, token_amount);

        CfdFreeStringBuffer(entropy);
        CfdFreeStringBuffer(nonce);
        CfdFreeStringBuffer(asset_value);
        CfdFreeStringBuffer(token_value);
      }
    }

    if (ret == kCfdSuccess) {
      char* asset_string = nullptr;
      int64_t value_satoshi = 0;
      char* value_commitment = nullptr;
      char* nonce = nullptr;
      char* locking_script = nullptr;
      ret = CfdGetConfidentialTxOutSimpleByHandle(
          handle, tx_handle, 3, &asset_string, &value_satoshi, &value_commitment,
          &nonce, &locking_script);
      EXPECT_EQ(kCfdSuccess, ret);
      if (ret == kCfdSuccess) {
        EXPECT_STREQ("accb7354c07974e00b32e4e5eef55078490141675592ac3610e6101831edb0cd", asset_string);
        EXPECT_STREQ("010000000023c34600", value_commitment);
        EXPECT_STREQ("03ce4c4eac09fe317f365e45c00ffcf2e9639bc0fd792c10f72cdc173c4e5ed879", nonce);
        EXPECT_STREQ("76a9149bdcb18911fa9faad6632ca43b81739082b0a19588ac", locking_script);
        EXPECT_EQ(600000000, value_satoshi);

        CfdFreeStringBuffer(asset_string);
        CfdFreeStringBuffer(value_commitment);
        CfdFreeStringBuffer(nonce);
        CfdFreeStringBuffer(locking_script);
      }
    }

    ret = CfdFreeTxDataHandle(handle, tx_handle);
    EXPECT_EQ(kCfdSuccess, ret);
  }

  ret = CfdGetLastErrorCode(handle);
  if (ret != kCfdSuccess) {
    char* str_buffer = NULL;
    ret = CfdGetLastErrorMessage(handle, &str_buffer);
    EXPECT_EQ(kCfdSuccess, ret);
    EXPECT_STREQ("", str_buffer);
    CfdFreeStringBuffer(str_buffer);
    str_buffer = NULL;
  }

  ret = CfdFreeHandle(handle);
  EXPECT_EQ(kCfdSuccess, ret);
}